

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

void aom_denoise_and_model_free(aom_denoise_and_model_t *ctx)

{
  long lVar1;
  
  aom_free(ctx->flat_blocks);
  for (lVar1 = 5; lVar1 != 8; lVar1 = lVar1 + 1) {
    aom_free(ctx->noise_psd[lVar1 + -2]);
    aom_free(ctx->noise_psd[lVar1 + -5]);
  }
  aom_noise_model_free(&ctx->noise_model);
  aom_flat_block_finder_free(&ctx->flat_block_finder);
  aom_free(ctx);
  return;
}

Assistant:

void aom_denoise_and_model_free(struct aom_denoise_and_model_t *ctx) {
  aom_free(ctx->flat_blocks);
  for (int i = 0; i < 3; ++i) {
    aom_free(ctx->denoised[i]);
    aom_free(ctx->noise_psd[i]);
  }
  aom_noise_model_free(&ctx->noise_model);
  aom_flat_block_finder_free(&ctx->flat_block_finder);
  aom_free(ctx);
}